

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-debug.cpp
# Opt level: O1

Expression * __thiscall wasm::Debug::AddrExprMap::getEnd(AddrExprMap *this,BinaryLocation addr)

{
  ulong uVar1;
  _Hash_node_base *p_Var2;
  Expression *pEVar3;
  ulong uVar4;
  __node_base_ptr p_Var5;
  __node_base_ptr p_Var6;
  
  uVar1 = (this->endMap)._M_h._M_bucket_count;
  uVar4 = (ulong)addr % uVar1;
  p_Var5 = (this->endMap)._M_h._M_buckets[uVar4];
  p_Var6 = (__node_base_ptr)0x0;
  if ((p_Var5 != (__node_base_ptr)0x0) &&
     (p_Var2 = p_Var5->_M_nxt, p_Var6 = p_Var5, *(BinaryLocation *)&p_Var5->_M_nxt[1]._M_nxt != addr
     )) {
    while (p_Var5 = p_Var2, p_Var2 = p_Var5->_M_nxt, p_Var2 != (_Hash_node_base *)0x0) {
      p_Var6 = (__node_base_ptr)0x0;
      if (((ulong)*(uint *)&p_Var2[1]._M_nxt % uVar1 != uVar4) ||
         (p_Var6 = p_Var5, *(uint *)&p_Var2[1]._M_nxt == addr)) goto LAB_00c90d7e;
    }
    p_Var6 = (__node_base_ptr)0x0;
  }
LAB_00c90d7e:
  if (p_Var6 == (__node_base_ptr)0x0) {
    p_Var2 = (_Hash_node_base *)0x0;
  }
  else {
    p_Var2 = p_Var6->_M_nxt;
  }
  if (p_Var2 == (_Hash_node_base *)0x0) {
    pEVar3 = (Expression *)0x0;
  }
  else {
    pEVar3 = (Expression *)p_Var2[2]._M_nxt;
  }
  return pEVar3;
}

Assistant:

Expression* getEnd(BinaryLocation addr) const {
    auto iter = endMap.find(addr);
    if (iter != endMap.end()) {
      return iter->second;
    }
    return nullptr;
  }